

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmEndIfCommand.h
# Opt level: O0

cmCommand * __thiscall cmEndIfCommand::Clone(cmEndIfCommand *this)

{
  cmCommand *this_00;
  cmEndIfCommand *this_local;
  
  this_00 = (cmCommand *)operator_new(0x50);
  cmEndIfCommand((cmEndIfCommand *)this_00);
  return this_00;
}

Assistant:

virtual cmCommand* Clone()
    {
    return new cmEndIfCommand;
    }